

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<char[9],char[7],char[7]>
          (Capturer *this,size_t index,char (*value) [9],char (*values) [7],char (*values_1) [7])

{
  string local_50;
  char (*local_30) [7];
  char (*values_local_1) [7];
  char (*values_local) [7];
  char (*value_local) [9];
  size_t index_local;
  Capturer *this_local;
  
  local_30 = values_1;
  values_local_1 = values;
  values_local = (char (*) [7])value;
  value_local = (char (*) [9])index;
  index_local = (size_t)this;
  Detail::stringify<char[9]>(&local_50,value);
  captureValue(this,index,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  captureValues<char[7],char[7]>(this,(size_t)(*value_local + 1),values_local_1,local_30);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }